

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdCreateExtkey(void *handle,int network_type,int key_type,char *parent_key,char *fingerprint,
                   char *key,char *chain_code,uchar depth,uint32_t child_number,char **extkey)

{
  bool bVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  char *in_RCX;
  int in_EDX;
  char *in_R8;
  char *in_R9;
  char *in_stack_00000008;
  uint8_t in_stack_00000010;
  uint32_t in_stack_00000018;
  undefined8 *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ExtPubkey extpubkey_1;
  ExtPubkey extpubkey;
  ExtPrivkey extprivkey_1;
  ExtPrivkey extprivkey;
  Privkey parent_privkey;
  Privkey privkey;
  string fingerprint_str;
  string parent_key_str;
  string chain_code_str;
  string key_str;
  NetType net_type;
  bool is_bitcoin;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  ExtPrivkey *in_stack_fffffffffffff9c0;
  string *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  CfdError error_code;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  NetType NVar6;
  bool *in_stack_fffffffffffffa18;
  undefined8 in_stack_fffffffffffffa20;
  int network_type_00;
  string *message;
  string local_578;
  ByteData256 local_558;
  Pubkey local_540;
  ByteData local_528;
  ExtPubkey local_510;
  string local_4a0;
  ByteData256 local_480;
  Pubkey local_468;
  Pubkey local_450;
  ExtPubkey local_438;
  string local_3c8;
  ByteData256 local_3a8;
  ByteData local_390;
  ExtPrivkey local_378;
  string local_300;
  ByteData256 local_2e0;
  ExtPrivkey local_2c8;
  Privkey local_250;
  Privkey local_230;
  Privkey local_210;
  Privkey local_1f0;
  Privkey local_1d0;
  Privkey local_1b0;
  string local_190;
  string local_170;
  string local_149;
  allocator local_121;
  string local_120;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  NetType local_c0;
  byte local_bb;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  char *local_30;
  char *local_28;
  char *local_20;
  int local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  network_type_00 = (int)((ulong)in_stack_fffffffffffffa20 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  cfd::Initialize();
  if (in_stack_00000020 == (undefined8 *)0x0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x6ad;
    local_58.funcname = "CfdCreateExtkey";
    cfd::core::logger::warn<>(&local_58,"extkey is null.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Failed to parameter. extkey is null.",&local_79);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               error_code,in_stack_fffffffffffff9d0);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (bVar1) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x6b3;
    local_98.funcname = "CfdCreateExtkey";
    cfd::core::logger::warn<>(&local_98,"key is null or empty.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. key is null or empty.",&local_b9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               error_code,in_stack_fffffffffffff9d0);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_bb = 1;
  local_c0 = cfd::capi::ConvertNetType(network_type_00,in_stack_fffffffffffffa18);
  if ((local_bb & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,local_30,&local_121);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    message = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_149.field_0x1,in_stack_00000008,(allocator *)message);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::string((string *)&local_170);
    bVar1 = cfd::capi::IsEmptyString(local_20);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)&local_170,local_20);
    }
    std::__cxx11::string::string((string *)&local_190);
    bVar1 = cfd::capi::IsEmptyString(local_28);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)&local_190,local_28);
    }
    if (local_18 == 0) {
      cfd::core::Privkey::Privkey(&local_1b0);
      lVar3 = std::__cxx11::string::size();
      if (lVar3 == 0x40) {
        cfd::core::Privkey::Privkey(&local_1d0,&local_120,kMainnet,true);
        cfd::core::Privkey::operator=
                  ((Privkey *)in_stack_fffffffffffff9c0,
                   (Privkey *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        cfd::core::Privkey::~Privkey((Privkey *)0x5dcdf8);
      }
      else {
        cfd::core::Privkey::FromWif(&local_1f0,&local_120,local_c0,true);
        cfd::core::Privkey::operator=
                  ((Privkey *)in_stack_fffffffffffff9c0,
                   (Privkey *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        cfd::core::Privkey::~Privkey((Privkey *)0x5dce58);
      }
      uVar4 = std::__cxx11::string::empty();
      NVar6 = local_c0;
      if ((uVar4 & 1) == 0) {
        cfd::core::ByteData::ByteData(&local_390,&local_190);
        cfd::core::ByteData256::ByteData256(&local_3a8,(string *)&local_149.field_0x1);
        cfd::core::ExtPrivkey::ExtPrivkey
                  (&local_378,NVar6,&local_390,&local_1b0,&local_3a8,in_stack_00000010,
                   in_stack_00000018);
        cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5dd105);
        cfd::core::ByteData::~ByteData((ByteData *)0x5dd112);
        cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_3c8,&local_378);
        pcVar5 = cfd::capi::CreateString(message);
        *in_stack_00000020 = pcVar5;
        std::__cxx11::string::~string((string *)&local_3c8);
        cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff9c0);
      }
      else {
        cfd::core::Privkey::Privkey(&local_210);
        lVar3 = std::__cxx11::string::size();
        if (lVar3 == 0x40) {
          cfd::core::Privkey::Privkey(&local_230,&local_170,kMainnet,true);
          cfd::core::Privkey::operator=
                    ((Privkey *)in_stack_fffffffffffff9c0,
                     (Privkey *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          cfd::core::Privkey::~Privkey((Privkey *)0x5dced0);
        }
        else {
          cfd::core::Privkey::FromWif(&local_250,&local_170,local_c0,true);
          cfd::core::Privkey::operator=
                    ((Privkey *)in_stack_fffffffffffff9c0,
                     (Privkey *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          cfd::core::Privkey::~Privkey((Privkey *)0x5dcf30);
        }
        NVar6 = local_c0;
        cfd::core::ByteData256::ByteData256(&local_2e0,(string *)&local_149.field_0x1);
        cfd::core::ExtPrivkey::ExtPrivkey
                  (&local_2c8,NVar6,&local_210,&local_1b0,&local_2e0,in_stack_00000010,
                   in_stack_00000018);
        cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5dcf9f);
        cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_300,&local_2c8);
        pcVar5 = cfd::capi::CreateString(message);
        *in_stack_00000020 = pcVar5;
        std::__cxx11::string::~string((string *)&local_300);
        cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff9c0);
        cfd::core::Privkey::~Privkey((Privkey *)0x5dd001);
      }
      cfd::core::Privkey::~Privkey((Privkey *)0x5dd205);
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      NVar6 = local_c0;
      if ((uVar4 & 1) == 0) {
        cfd::core::ByteData::ByteData(&local_528,&local_190);
        cfd::core::Pubkey::Pubkey(&local_540,&local_120);
        cfd::core::ByteData256::ByteData256(&local_558,(string *)&local_149.field_0x1);
        cfd::core::ExtPubkey::ExtPubkey
                  (&local_510,NVar6,&local_528,&local_540,&local_558,in_stack_00000010,
                   in_stack_00000018);
        cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5dd495);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5dd4a2);
        cfd::core::ByteData::~ByteData((ByteData *)0x5dd4af);
        cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_578,&local_510);
        pcVar5 = cfd::capi::CreateString(message);
        *in_stack_00000020 = pcVar5;
        std::__cxx11::string::~string((string *)&local_578);
        cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff9c0);
      }
      else {
        cfd::core::Pubkey::Pubkey(&local_450,&local_170);
        cfd::core::Pubkey::Pubkey(&local_468,&local_120);
        cfd::core::ByteData256::ByteData256(&local_480,(string *)&local_149.field_0x1);
        cfd::core::ExtPubkey::ExtPubkey
                  (&local_438,NVar6,&local_450,&local_468,&local_480,in_stack_00000010,
                   in_stack_00000018);
        cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5dd2cf);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5dd2dc);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5dd2e9);
        cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_4a0,&local_438);
        pcVar5 = cfd::capi::CreateString(message);
        *in_stack_00000020 = pcVar5;
        std::__cxx11::string::~string((string *)&local_4a0);
        cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff9c0);
      }
    }
    local_4 = 0;
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_149.field_0x1);
    std::__cxx11::string::~string((string *)&local_120);
    return local_4;
  }
  local_d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_d8.filename = local_d8.filename + 1;
  local_d8.line = 0x6bc;
  local_d8.funcname = "CfdCreateExtkey";
  cfd::core::logger::warn<>(&local_d8,"privkey\'s network_type is invalid.");
  local_fa = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,"Failed to parameter. privkey\'s network_type is invalid.",&local_f9);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
             error_code,in_stack_fffffffffffff9d0);
  local_fa = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

CFDC_API int CfdCreateExtkey(
    void* handle, int network_type, int key_type, const char* parent_key,
    const char* fingerprint, const char* key, const char* chain_code,
    unsigned char depth, uint32_t child_number, char** extkey) {
  try {
    cfd::Initialize();
    if (extkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null.");
    }
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    std::string key_str = key;
    std::string chain_code_str = chain_code;
    std::string parent_key_str;
    if (!IsEmptyString(parent_key)) {
      parent_key_str = parent_key;
    }
    std::string fingerprint_str;
    if (!IsEmptyString(fingerprint)) {
      fingerprint_str = fingerprint;
    }

    if (key_type == ExtKeyType::kExtPrivkey) {
      Privkey privkey;
      if (key_str.size() == (Privkey::kPrivkeySize * 2)) {
        privkey = Privkey(key_str);
      } else {
        privkey = Privkey::FromWif(key_str, net_type);
      }
      if (fingerprint_str.empty()) {
        Privkey parent_privkey;
        if (parent_key_str.size() == (Privkey::kPrivkeySize * 2)) {
          parent_privkey = Privkey(parent_key_str);
        } else {
          parent_privkey = Privkey::FromWif(parent_key_str, net_type);
        }
        ExtPrivkey extprivkey(
            net_type, parent_privkey, privkey, ByteData256(chain_code_str),
            depth, child_number);
        *extkey = CreateString(extprivkey.ToString());
      } else {
        ExtPrivkey extprivkey(
            net_type, ByteData(fingerprint_str), privkey,
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extprivkey.ToString());
      }
    } else {
      if (fingerprint_str.empty()) {
        ExtPubkey extpubkey(
            net_type, Pubkey(parent_key_str), Pubkey(key_str),
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extpubkey.ToString());
      } else {
        ExtPubkey extpubkey(
            net_type, ByteData(fingerprint_str), Pubkey(key_str),
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extpubkey.ToString());
      }
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}